

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Framebuffer::destroyBuffer(Framebuffer *this,deUint32 name,GLenum type)

{
  deUint32 local_14;
  GLenum type_local;
  deUint32 name_local;
  Framebuffer *this_local;
  
  local_14 = name;
  _type_local = this;
  if ((type == 0xde1) || (type == 0x8513)) {
    (*this->m_context->_vptr_Context[8])(this->m_context,1,&local_14);
  }
  else if (type == 0x8d41) {
    (*this->m_context->_vptr_Context[0xe])(this->m_context,1,&local_14);
  }
  return;
}

Assistant:

void Framebuffer::destroyBuffer (deUint32 name, GLenum type)
{
	if (type == GL_TEXTURE_2D || type == GL_TEXTURE_CUBE_MAP)
		m_context.deleteTextures(1, &name);
	else if (type == GL_RENDERBUFFER)
		m_context.deleteRenderbuffers(1, &name);
	else
		DE_ASSERT(type == GL_NONE);
}